

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgPrettyPrinter.cpp
# Opt level: O3

void __thiscall rsg::PrettyPrinter::processToken(PrettyPrinter *this,Token *token)

{
  byte bVar1;
  Type TVar2;
  ostream *poVar3;
  pointer pcVar4;
  bool bVar5;
  long lVar6;
  size_type sVar7;
  int iVar8;
  string f;
  ostringstream s;
  long *local_1c8 [2];
  long local_1b8 [2];
  double local_1a8;
  long *local_1a0;
  long local_198;
  long local_190 [12];
  ios_base local_130 [264];
  
  sVar7 = (this->m_line)._M_string_length;
  if (sVar7 == 0) {
    bVar5 = false;
  }
  else {
    bVar1 = (this->m_line)._M_dataplus._M_p[sVar7 - 1];
    bVar5 = true;
    if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
      bVar5 = bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10;
    }
  }
  TVar2 = token->m_type;
  if ((int)TVar2 < 0x33) {
    if (TVar2 == IDENTIFIER) {
      if (bVar5) {
        std::__cxx11::string::append((char *)this);
      }
      goto LAB_005bcff4;
    }
    if (TVar2 == FLOAT_LITERAL) {
      local_1a8 = (double)(token->m_arg).floatValue;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::ostream::_M_insert<double>(local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
      lVar6 = std::__cxx11::string::find((char)local_1c8,0x2e);
      if (lVar6 == -1) {
        std::__cxx11::string::append((char *)local_1c8);
      }
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1c8[0]);
LAB_005bd097:
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      return;
    }
    if (TVar2 == INT_LITERAL) {
      iVar8 = (token->m_arg).intValue;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::ostream::operator<<((ostringstream *)&local_1a0,iVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      std::ios_base::~ios_base(local_130);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1c8[0]);
      goto LAB_005bd097;
    }
  }
  else if ((int)TVar2 < 0x51) {
    if (TVar2 == BOOL_LITERAL) goto LAB_005bcff4;
    if (TVar2 == INDENT_INC) {
      this->m_indentDepth = this->m_indentDepth + 1;
      return;
    }
  }
  else {
    if (TVar2 == INDENT_DEC) {
      this->m_indentDepth = this->m_indentDepth + -1;
      return;
    }
    if (TVar2 == NEWLINE) {
      if (0 < this->m_indentDepth) {
        iVar8 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->m_str,"\t",1);
          iVar8 = iVar8 + 1;
        } while (iVar8 < this->m_indentDepth);
        sVar7 = (this->m_line)._M_string_length;
      }
      poVar3 = (ostream *)this->m_str;
      pcVar4 = (this->m_line)._M_dataplus._M_p;
      local_1a0 = local_190;
      std::__cxx11::string::_M_construct<char*>((string *)&local_1a0,pcVar4,pcVar4 + sVar7);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1a0,local_198);
      if (local_1a0 != local_190) {
        operator_delete(local_1a0,local_190[0] + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)this,0,(char *)(this->m_line)._M_string_length,0x659763);
      return;
    }
  }
  if ((bVar5) &&
     ((bVar1 = **(byte **)(s_tokenStr + (ulong)TVar2 * 8), (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a ||
      (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10)))) {
    std::__cxx11::string::append((char *)this);
  }
LAB_005bcff4:
  std::__cxx11::string::append((char *)this);
  return;
}

Assistant:

void PrettyPrinter::processToken (const Token& token)
{
	bool prevIsIdentifierChar = m_line.length() > 0 && isIdentifierChar(m_line[m_line.length()-1]);

	switch (token.getType())
	{
		case Token::IDENTIFIER:
			if (prevIsIdentifierChar)
				m_line += " ";
			m_line += token.getIdentifier();
			break;

		case Token::FLOAT_LITERAL:
		{
			std::string f = de::toString(token.getFloat());
			if (f.find('.') == std::string::npos)
				f += ".0"; // Make sure value parses as float
			m_line += f;
			break;
		}

		case Token::INT_LITERAL:
			m_line += de::toString(token.getInt());
			break;

		case Token::BOOL_LITERAL:
			m_line += (token.getBool() ? "true" : "false");
			break;

		case Token::INDENT_INC:
			m_indentDepth += 1;
			break;

		case Token::INDENT_DEC:
			m_indentDepth -= 1;
			break;

		case Token::NEWLINE:
			// Indent
			for (int i = 0; i < m_indentDepth; i++)
				m_str << "\t";

			// Flush line to source
			m_str << m_line + "\n";
			m_line = "";
			break;

		default:
		{
			const char* tokenStr = getSimpleTokenStr(token.getType());
			if (prevIsIdentifierChar && isIdentifierChar(tokenStr[0]))
				m_line += " ";
			m_line += tokenStr;
			break;
		}
	}
}